

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree-avl.c
# Opt level: O2

pboolean p_tree_avl_insert(PTreeBaseNode **root_node,PCompareDataFunc compare_func,ppointer data,
                          PDestroyFunc key_destroy_func,PDestroyFunc value_destroy_func,ppointer key
                          ,ppointer value)

{
  int iVar1;
  PTreeAVLNode_ *pPVar2;
  pint pVar3;
  PTreeBaseNode *pPVar4;
  PTreeBaseNode_ *pPVar5;
  PTreeBaseNode *pPVar6;
  PTreeBaseNode_ *pPVar7;
  pboolean pVar8;
  pboolean pVar9;
  PTreeAVLNode *node;
  PTreeBaseNode *pPVar10;
  
  pPVar6 = *root_node;
  pPVar7 = (PTreeBaseNode_ *)root_node;
  pPVar10 = pPVar6;
  while (pPVar6 != (PTreeBaseNode *)0x0) {
    pVar3 = (*compare_func)(key,pPVar6->key,data);
    if (pVar3 < 0) {
      pPVar4 = pPVar7->left;
      pPVar7 = pPVar4;
    }
    else {
      pPVar4 = pPVar7->left;
      if (pVar3 == 0) {
        if (pPVar4 != (PTreeBaseNode *)0x0) {
          if (key_destroy_func != (PDestroyFunc)0x0) {
            (*key_destroy_func)(pPVar4->key);
            pPVar4 = pPVar7->left;
          }
          if (value_destroy_func != (PDestroyFunc)0x0) {
            (*value_destroy_func)(pPVar4->value);
            pPVar4 = pPVar7->left;
          }
          pPVar4->key = key;
          pPVar7->left->value = value;
          goto LAB_00113cea;
        }
        break;
      }
      pPVar7 = (PTreeBaseNode_ *)&pPVar4->right;
    }
    pPVar10 = pPVar4;
    pPVar6 = pPVar7->left;
  }
  pPVar5 = (PTreeBaseNode_ *)p_malloc0(0x30);
  pPVar7->left = pPVar5;
  if (pPVar5 == (PTreeBaseNode_ *)0x0) {
LAB_00113cea:
    pVar8 = 0;
  }
  else {
    pPVar5->key = key;
    pPVar7->left->value = value;
    pPVar5 = pPVar7->left;
    *(undefined4 *)&pPVar5[1].right = 0;
    pPVar5[1].left = pPVar10;
    pVar8 = 1;
    node = *(PTreeAVLNode **)pPVar7;
    while (pPVar2 = node->parent, pPVar2 != (PTreeAVLNode_ *)0x0) {
      iVar1 = pPVar2->balance_factor;
      if ((PTreeAVLNode *)(pPVar2->base).left == node) {
        if (iVar1 == -1) goto LAB_00113d58;
        pVar9 = pVar8;
        if (iVar1 == 1) {
          if (node->balance_factor != -1) {
            pp_tree_avl_rotate_right(node,root_node);
            return 1;
          }
          pp_tree_avl_rotate_left_right(node,root_node);
          return 1;
        }
      }
      else {
        if (iVar1 == 1) {
LAB_00113d58:
          pPVar2->balance_factor = 0;
          return 1;
        }
        pVar9 = -1;
        if (iVar1 == -1) {
          if (node->balance_factor == 1) {
            pp_tree_avl_rotate_right_left(node,root_node);
            return 1;
          }
          pp_tree_avl_rotate_left(node,root_node);
          return 1;
        }
      }
      pPVar2->balance_factor = pVar9;
      node = pPVar2;
    }
  }
  return pVar8;
}

Assistant:

pboolean
p_tree_avl_insert (PTreeBaseNode	**root_node,
		   PCompareDataFunc	compare_func,
		   ppointer		data,
		   PDestroyFunc		key_destroy_func,
		   PDestroyFunc		value_destroy_func,
		   ppointer		key,
		   ppointer		value)
{
	PTreeBaseNode	**cur_node;
	PTreeBaseNode	*parent_node;
	pint		cmp_result;

	cur_node    = root_node;
	parent_node = *root_node;

	/* Find where to insert the node */
	while (*cur_node != NULL) {
		cmp_result = compare_func (key, (*cur_node)->key, data);

		if (cmp_result < 0) {
			parent_node = *cur_node;
			cur_node    = &(*cur_node)->left;
		} else if (cmp_result > 0) {
			parent_node = *cur_node;
			cur_node    = &(*cur_node)->right;
		} else
			break;
	}

	/* If we have existing one - replace a key-value pair */
	if (*cur_node != NULL) {
		if (key_destroy_func != NULL)
			key_destroy_func ((*cur_node)->key);

		if (value_destroy_func != NULL)
			value_destroy_func ((*cur_node)->value);

		(*cur_node)->key   = key;
		(*cur_node)->value = value;

		return FALSE;
	}

	if (P_UNLIKELY ((*cur_node = p_malloc0 (sizeof (PTreeAVLNode))) == NULL))
		return FALSE;

	(*cur_node)->key   = key;
	(*cur_node)->value = value;

	((PTreeAVLNode *) *cur_node)->balance_factor = 0;
	((PTreeAVLNode *) *cur_node)->parent         = (PTreeAVLNode *) parent_node;

	/* Balance the tree */
	pp_tree_avl_balance_insert (((PTreeAVLNode *) *cur_node), root_node);

	return TRUE;
}